

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

whisper_context *
whisper_init_from_file_with_params_no_state(char *path_model,whisper_context_params params)

{
  whisper_context_params params_00;
  byte bVar1;
  char *in_RDI;
  whisper_context *ctx;
  whisper_model_loader loader;
  ifstream fin;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 *puVar2;
  undefined7 in_stack_fffffffffffffd70;
  __2 local_24b;
  __1 local_24a;
  __0 local_249;
  long *local_248;
  _func_size_t_void_ptr_void_ptr_size_t *p_Stack_240;
  _func_bool_void_ptr *local_238;
  _func_void_void_ptr *p_Stack_230;
  undefined4 local_228;
  long local_218 [65];
  char *local_10;
  whisper_context *local_8;
  
  puVar2 = (undefined8 *)&stack0x00000008;
  local_10 = in_RDI;
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: loading model from \'%s\'\n",
             "whisper_init_from_file_with_params_no_state",in_RDI);
  std::ifstream::ifstream(local_218,local_10,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    local_238 = (_func_bool_void_ptr *)0x0;
    p_Stack_230 = (_func_void_void_ptr *)0x0;
    p_Stack_240 = (_func_size_t_void_ptr_void_ptr_size_t *)0x0;
    local_248 = local_218;
    p_Stack_240 = whisper_init_from_file_with_params_no_state::$_0::
                  operator_cast_to_function_pointer(&local_249);
    local_238 = whisper_init_from_file_with_params_no_state::$_1::operator_cast_to_function_pointer
                          (&local_24a);
    p_Stack_230 = whisper_init_from_file_with_params_no_state::$_2::
                  operator_cast_to_function_pointer(&local_24b);
    params_00._8_8_ = puVar2;
    params_00.use_gpu = (bool)(char)in_stack_fffffffffffffd60;
    params_00.flash_attn = (bool)(char)((ulong)in_stack_fffffffffffffd60 >> 8);
    params_00._2_2_ = (short)((ulong)in_stack_fffffffffffffd60 >> 0x10);
    params_00.gpu_device = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    params_00._16_7_ = in_stack_fffffffffffffd70;
    params_00._23_1_ = bVar1;
    params_00.dtw_aheads.n_heads = *puVar2;
    params_00.dtw_aheads.heads = (whisper_ahead *)puVar2[1];
    params_00.dtw_mem_size = puVar2[2];
    local_8 = whisper_init_with_params_no_state((whisper_model_loader *)puVar2[4],params_00);
    if (local_8 != (whisper_context *)0x0) {
      std::__cxx11::string::operator=((string *)&local_8->path_model,local_10);
    }
  }
  else {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: failed to open \'%s\'\n",
               "whisper_init_from_file_with_params_no_state",local_10);
    local_8 = (whisper_context *)0x0;
  }
  local_228 = 1;
  std::ifstream::~ifstream(local_218);
  return local_8;
}

Assistant:

struct whisper_context * whisper_init_from_file_with_params_no_state(const char * path_model, struct whisper_context_params params) {
    WHISPER_LOG_INFO("%s: loading model from '%s'\n", __func__, path_model);
#ifdef _MSC_VER
    // Convert UTF-8 path to wide string (UTF-16) for Windows, resolving character encoding issues.
    std::wstring_convert<std::codecvt_utf8<wchar_t>> converter;
    std::wstring path_model_wide = converter.from_bytes(path_model);
    auto fin = std::ifstream(path_model_wide, std::ios::binary);
#else
    auto fin = std::ifstream(path_model, std::ios::binary);
#endif
    if (!fin) {
        WHISPER_LOG_ERROR("%s: failed to open '%s'\n", __func__, path_model);
        return nullptr;
    }

    whisper_model_loader loader = {};

    loader.context = &fin;

    loader.read = [](void * ctx, void * output, size_t read_size) {
        std::ifstream * fin = (std::ifstream*)ctx;
        fin->read((char *)output, read_size);
        return read_size;
    };

    loader.eof = [](void * ctx) {
        std::ifstream * fin = (std::ifstream*)ctx;
        return fin->eof();
    };

    loader.close = [](void * ctx) {
        std::ifstream * fin = (std::ifstream*)ctx;
        fin->close();
    };

    auto ctx = whisper_init_with_params_no_state(&loader, params);

    if (ctx) {
        ctx->path_model = path_model;
    }

    return ctx;
}